

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTimeCode.cpp
# Opt level: O0

void __thiscall
Imf_3_4::TimeCode::TimeCode
          (TimeCode *this,int hours,int minutes,int seconds,int frame,bool dropFrame,bool colorFrame
          ,bool fieldPhase,bool bgf0,bool bgf1,bool bgf2,int binaryGroup1,int binaryGroup2,
          int binaryGroup3,int binaryGroup4,int binaryGroup5,int binaryGroup6,int binaryGroup7,
          int binaryGroup8)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  TimeCode *unaff_RBX;
  byte bVar4;
  byte bVar5;
  undefined4 *in_RDI;
  byte bVar6;
  byte in_R9B;
  byte in_stack_00000008;
  byte in_stack_00000028;
  bool value;
  undefined2 in_stack_ffffffffffffffd0;
  undefined4 *puVar7;
  
  bVar6 = in_R9B & 1;
  bVar5 = in_stack_00000008 & 1;
  bVar4 = (byte)frame & 1;
  bVar3 = (byte)minutes & 1;
  bVar2 = (byte)this & 1;
  bVar1 = in_stack_00000028 & 1;
  *in_RDI = 0;
  in_RDI[1] = 0;
  puVar7 = in_RDI;
  setHours(unaff_RBX,(int)((ulong)in_RDI >> 0x20));
  setMinutes(unaff_RBX,(int)((ulong)puVar7 >> 0x20));
  setSeconds(unaff_RBX,(int)((ulong)puVar7 >> 0x20));
  setFrame(unaff_RBX,(int)((ulong)puVar7 >> 0x20));
  value = SUB81((ulong)in_RDI >> 0x38,0);
  setDropFrame((TimeCode *)
               CONCAT17(bVar6,CONCAT16(bVar5,CONCAT15(bVar4,CONCAT14(bVar3,CONCAT13(bVar2,CONCAT12(
                                                  bVar1,in_stack_ffffffffffffffd0)))))),value);
  setColorFrame((TimeCode *)
                CONCAT17(bVar6,CONCAT16(bVar5,CONCAT15(bVar4,CONCAT14(bVar3,CONCAT13(bVar2,CONCAT12(
                                                  bVar1,in_stack_ffffffffffffffd0)))))),value);
  setFieldPhase((TimeCode *)
                CONCAT17(bVar6,CONCAT16(bVar5,CONCAT15(bVar4,CONCAT14(bVar3,CONCAT13(bVar2,CONCAT12(
                                                  bVar1,in_stack_ffffffffffffffd0)))))),value);
  setBgf0((TimeCode *)
          CONCAT17(bVar6,CONCAT16(bVar5,CONCAT15(bVar4,CONCAT14(bVar3,CONCAT13(bVar2,CONCAT12(bVar1,
                                                  in_stack_ffffffffffffffd0)))))),value);
  setBgf1((TimeCode *)
          CONCAT17(bVar6,CONCAT16(bVar5,CONCAT15(bVar4,CONCAT14(bVar3,CONCAT13(bVar2,CONCAT12(bVar1,
                                                  in_stack_ffffffffffffffd0)))))),value);
  setBgf2((TimeCode *)
          CONCAT17(bVar6,CONCAT16(bVar5,CONCAT15(bVar4,CONCAT14(bVar3,CONCAT13(bVar2,CONCAT12(bVar1,
                                                  in_stack_ffffffffffffffd0)))))),value);
  setBinaryGroup(unaff_RBX,(int)((ulong)puVar7 >> 0x20),(int)puVar7);
  setBinaryGroup(unaff_RBX,(int)((ulong)puVar7 >> 0x20),(int)puVar7);
  setBinaryGroup(unaff_RBX,(int)((ulong)puVar7 >> 0x20),(int)puVar7);
  setBinaryGroup(unaff_RBX,(int)((ulong)puVar7 >> 0x20),(int)puVar7);
  setBinaryGroup(unaff_RBX,(int)((ulong)puVar7 >> 0x20),(int)puVar7);
  setBinaryGroup(unaff_RBX,(int)((ulong)puVar7 >> 0x20),(int)puVar7);
  setBinaryGroup(unaff_RBX,(int)((ulong)puVar7 >> 0x20),(int)puVar7);
  setBinaryGroup(unaff_RBX,(int)((ulong)puVar7 >> 0x20),(int)puVar7);
  return;
}

Assistant:

TimeCode::TimeCode (
    int  hours,
    int  minutes,
    int  seconds,
    int  frame,
    bool dropFrame,
    bool colorFrame,
    bool fieldPhase,
    bool bgf0,
    bool bgf1,
    bool bgf2,
    int  binaryGroup1,
    int  binaryGroup2,
    int  binaryGroup3,
    int  binaryGroup4,
    int  binaryGroup5,
    int  binaryGroup6,
    int  binaryGroup7,
    int  binaryGroup8)
    : _time (0), _user (0)
{
    setHours (hours);
    setMinutes (minutes);
    setSeconds (seconds);
    setFrame (frame);
    setDropFrame (dropFrame);
    setColorFrame (colorFrame);
    setFieldPhase (fieldPhase);
    setBgf0 (bgf0);
    setBgf1 (bgf1);
    setBgf2 (bgf2);
    setBinaryGroup (1, binaryGroup1);
    setBinaryGroup (2, binaryGroup2);
    setBinaryGroup (3, binaryGroup3);
    setBinaryGroup (4, binaryGroup4);
    setBinaryGroup (5, binaryGroup5);
    setBinaryGroup (6, binaryGroup6);
    setBinaryGroup (7, binaryGroup7);
    setBinaryGroup (8, binaryGroup8);
}